

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhsts.cpp
# Opt level: O2

bool __thiscall QHstsHeaderParser::parseSTSHeader(QHstsHeaderParser *this)

{
  int iVar1;
  char *pcVar2;
  long lVar3;
  bool bVar4;
  long in_FS_OFFSET;
  char *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  QDateTime::QDateTime((QDateTime *)&local_40);
  pcVar2 = *(char **)&this->expiry;
  *(char **)&this->expiry = local_40;
  local_40 = pcVar2;
  QDateTime::~QDateTime((QDateTime *)&local_40);
  this->maxAgeFound = false;
  this->subDomainsFound = false;
  this->maxAge = 0;
  this->tokenPos = 0;
  QByteArray::clear();
  do {
    do {
      iVar1 = this->tokenPos;
      lVar3 = (this->header).d.size;
      if (lVar3 <= iVar1) goto LAB_0016cdb0;
      bVar4 = parseDirective(this);
      if (!bVar4) goto LAB_0016cdb0;
    } while ((this->token).d.size == 0);
    local_40 = ";";
    bVar4 = operator!=(&this->token,&local_40);
  } while (!bVar4);
LAB_0016cdb0:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return lVar3 <= iVar1;
  }
  __stack_chk_fail();
}

Assistant:

bool QHstsHeaderParser::parseSTSHeader()
{
    expiry = QDateTime();
    maxAgeFound = false;
    subDomainsFound = false;
    maxAge = 0;
    tokenPos = 0;
    token.clear();

    while (tokenPos < header.size()) {
        if (!parseDirective())
            return false;

        if (token.size() && token != ";") {
            // After a directive we can only have a ";" or no more tokens.
            // Invalid syntax.
            return false;
        }
    }

    return true;
}